

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressureBMP180.cpp
# Opt level: O2

void __thiscall RTPressureBMP180::pressureBackground(RTPressureBMP180 *this)

{
  bool bVar1;
  ulong in_RAX;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  undefined6 uStack_18;
  uint8_t data [2];
  
  _uStack_18 = in_RAX;
  if (this->m_state == 2) {
    bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                              this->m_pressureAddr,0xf4,'\x01',data,
                              "Failed to read BMP180 pressure conv status");
    if (!bVar1) {
      return;
    }
    if ((_uStack_18 & 0x20000000000000) != 0) {
      return;
    }
    bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                              this->m_pressureAddr,0xf6,'\x02',data,
                              "Failed to read BMP180 temp conv result");
    if (bVar1) {
      this->m_rawPressure = (short)data << 8 | (ushort)data >> 8;
      bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                this->m_pressureAddr,0xf8,'\x01',data,"Failed to read BMP180 XLSB");
      if (bVar1) {
        this->m_state = 0;
        uVar3 = ((uint)this->m_rawTemperature - this->m_AC6) * this->m_AC5 >> 0xf;
        iVar5 = this->m_MD + uVar3;
        if (iVar5 == 0) {
          return;
        }
        bVar2 = (byte)this->m_oss;
        iVar5 = (this->m_MC << 0xb) / iVar5;
        this->m_temperature = (float)((int)(iVar5 + uVar3 + 8) / 0x10) / 10.0;
        iVar5 = iVar5 + uVar3 + -4000;
        uVar3 = (uint)(iVar5 * iVar5) >> 0xc;
        uVar4 = (long)(((int)(uVar3 * this->m_B1) / 0x10000 + (iVar5 * this->m_AC3) / 0x2000 + 2) /
                       4 + 0x8000) * (ulong)this->m_AC4 >> 0xf;
        uVar3 = (50000U >> (bVar2 & 0x1f)) *
                ((((this->m_AC2 * iVar5) / 0x800 + this->m_AC1 * 4 +
                   (int)(this->m_B2 * uVar3) / 0x800 << (bVar2 & 0x1f)) + 2) / -4 +
                (uint)(uint3)(CONCAT21(this->m_rawPressure,data[0]) >> (8 - bVar2 & 0x1f)));
        if ((int)uVar3 < 0) {
          iVar5 = (int)((ulong)uVar3 / (uVar4 & 0xffffffff)) * 2;
        }
        else {
          iVar5 = (int)((ulong)(uVar3 * 2) / (uVar4 & 0xffffffff));
        }
        this->m_pressure =
             (float)((int)((iVar5 * -0x1cbd) / 0x10000 +
                           ((uint)((iVar5 / 0x100) * (iVar5 / 0x100) * 0xbde) >> 0x10) + 0xecf) /
                     0x10 + iVar5) / 100.0;
        this->m_validReadings = true;
        return;
      }
    }
  }
  else {
    if (this->m_state != 1) {
      return;
    }
    bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                              this->m_pressureAddr,0xf4,'\x01',data,
                              "Failed to read BMP180 temp conv status");
    if (!bVar1) {
      return;
    }
    if ((_uStack_18 & 0x20000000000000) != 0) {
      return;
    }
    bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                              this->m_pressureAddr,0xf6,'\x02',data,
                              "Failed to read BMP180 temp conv result");
    if (bVar1) {
      this->m_rawTemperature = (short)data << 8 | (ushort)data >> 8;
      _uStack_18 = CONCAT17(data[1],CONCAT16((char)this->m_oss << 6,uStack_18)) | 0x34000000000000;
      bVar1 = RTIMUHal::HALWrite(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                 this->m_pressureAddr,0xf4,'\x01',data,
                                 "Failed to start pressure conversion");
      if (bVar1) {
        this->m_state = 2;
        return;
      }
    }
  }
  this->m_state = 0;
  return;
}

Assistant:

void RTPressureBMP180::pressureBackground()
{
    uint8_t data[2];

    switch (m_state) {
        case BMP180_STATE_IDLE:
        break;

        case BMP180_STATE_TEMPERATURE:
        if (!m_settings->HALRead(m_pressureAddr, BMP180_REG_SCO, 1, data, "Failed to read BMP180 temp conv status")) {
            break;
        }
        if ((data[0] & 0x20) == 0x20)
            break;                                      // conversion not finished
        if (!m_settings->HALRead(m_pressureAddr, BMP180_REG_RESULT, 2, data, "Failed to read BMP180 temp conv result")) {
            m_state = BMP180_STATE_IDLE;
            break;
        }
        m_rawTemperature = (((uint16_t)data[0]) << 8) + (uint16_t)data[1];

        data[0] = 0x34 + (m_oss << 6);
        if (!m_settings->HALWrite(m_pressureAddr, BMP180_REG_SCO, 1, data, "Failed to start pressure conversion")) {
            m_state = BMP180_STATE_IDLE;
            break;
        }
        m_state = BMP180_STATE_PRESSURE;
        break;

        case BMP180_STATE_PRESSURE:
        if (!m_settings->HALRead(m_pressureAddr, BMP180_REG_SCO, 1, data, "Failed to read BMP180 pressure conv status")) {
            break;
        }
        if ((data[0] & 0x20) == 0x20)
            break;                                      // conversion not finished
        if (!m_settings->HALRead(m_pressureAddr, BMP180_REG_RESULT, 2, data, "Failed to read BMP180 temp conv result")) {
            m_state = BMP180_STATE_IDLE;
            break;
        }
        m_rawPressure = (((uint16_t)data[0]) << 8) + (uint16_t)data[1];

        if (!m_settings->HALRead(m_pressureAddr, BMP180_REG_XLSB, 1, data, "Failed to read BMP180 XLSB")) {
            m_state = BMP180_STATE_IDLE;
            break;
        }

        // call this function for testing only
        // should give T = 150 (15.0C) and pressure 6996 (699.6hPa)

        // setTestData();

        int32_t pressure = ((((uint32_t)(m_rawPressure)) << 8) + (uint32_t)(data[0])) >> (8 - m_oss);

        m_state = BMP180_STATE_IDLE;

        // calculate compensated temperature

        int32_t X1 = (((int32_t)m_rawTemperature - m_AC6) * m_AC5) / 32768;

        if ((X1 + m_MD) == 0) {
            break;
        }

        int32_t X2 = (m_MC * 2048)  / (X1 + m_MD);
        int32_t B5 = X1 + X2;
        m_temperature = (RTFLOAT)((B5 + 8) / 16) / (RTFLOAT)10;

        // calculate compensated pressure

        int32_t B6 = B5 - 4000;
        //          printf("B6 = %d\n", B6);
        X1 = (m_B2 * ((B6 * B6) / 4096)) / 2048;
        //          printf("X1 = %d\n", X1);
        X2 = (m_AC2 * B6) / 2048;
        //          printf("X2 = %d\n", X2);
        int32_t X3 = X1 + X2;
        //          printf("X3 = %d\n", X3);
        int32_t B3 = (((m_AC1 * 4 + X3) << m_oss) + 2) / 4;
        //          printf("B3 = %d\n", B3);
        X1 = (m_AC3 * B6) / 8192;
        //          printf("X1 = %d\n", X1);
        X2 = (m_B1 * ((B6 * B6) / 4096)) / 65536;
        //          printf("X2 = %d\n", X2);
        X3 = ((X1 + X2) + 2) / 4;
        //          printf("X3 = %d\n", X3);
        int32_t B4 = (m_AC4 * (unsigned long)(X3 + 32768)) / 32768;
        //          printf("B4 = %d\n", B4);
        uint32_t B7 = ((unsigned long)pressure - B3) * (50000 >> m_oss);
        //          printf("B7 = %d\n", B7);

        int32_t p;
        if (B7 < 0x80000000)
        p = (B7 * 2) / B4;
            else
        p = (B7 / B4) * 2;

        //          printf("p = %d\n", p);
        X1 = (p / 256) * (p / 256);
        //          printf("X1 = %d\n", X1);
        X1 = (X1 * 3038) / 65536;
        //          printf("X1 = %d\n", X1);
        X2 = (-7357 * p) / 65536;
        //          printf("X2 = %d\n", X2);
        m_pressure = (RTFLOAT)(p + (X1 + X2 + 3791) / 16) / (RTFLOAT)100;      // the extra 100 factor is to get 1hPa units

        m_validReadings = true;

        // printf("UP = %d, P = %f, UT = %d, T = %f\n", m_rawPressure, m_pressure, m_rawTemperature, m_temperature);
        break;
    }
}